

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O2

wchar_t rd_dungeon_aux(chunk **c)

{
  int iVar1;
  uint uVar2;
  chunk *c_00;
  char *pcVar3;
  loc grid;
  connector *pcVar4;
  bitflag *pbVar5;
  wchar_t wVar6;
  wchar_t y;
  ulong uVar7;
  uint8_t tmp8u;
  uint8_t count;
  uint16_t tmp16u;
  uint16_t width;
  uint16_t height;
  chunk **local_a0;
  char name [100];
  
  rd_string(name,100);
  iVar1 = bcmp(name,"arena",6);
  if ((iVar1 == 0) && (*c == (chunk *)cave)) {
    player->upkeep->arena_level = true;
  }
  local_a0 = c;
  rd_u16b(&height);
  rd_u16b(&width);
  c_00 = (chunk *)cave_new((uint)height,(uint)width);
  pcVar3 = string_make(name);
  c_00->name = pcVar3;
  uVar7 = 0;
  do {
    y = L'\0';
    if (square_size <= uVar7) {
      wVar6 = L'\0';
      do {
        if (c_00->height <= y) {
          rd_byte(&tmp8u);
          c_00->feeling = tmp8u;
          rd_u16b(&tmp16u);
          c_00->feeling_squares = tmp16u;
          rd_s32b(&c_00->turn);
          if ((player->opts).opt[0x2b] == true) {
            rd_byte(&tmp8u);
            while (tmp8u != 0xff) {
              pcVar4 = (connector *)mem_zalloc(0x20);
              pbVar5 = (bitflag *)mem_zalloc((ulong)square_size);
              pcVar4->info = pbVar5;
              (pcVar4->grid).x = (uint)tmp8u;
              rd_byte(&tmp8u);
              (pcVar4->grid).y = (uint)tmp8u;
              rd_byte(&pcVar4->feat);
              for (uVar7 = 0; uVar7 < square_size; uVar7 = uVar7 + 1) {
                rd_byte(pcVar4->info + uVar7);
              }
              pcVar4->next = c_00->join;
              c_00->join = pcVar4;
              rd_byte(&tmp8u);
            }
          }
          *local_a0 = c_00;
          return (wchar_t)local_a0;
        }
        rd_byte(&count);
        rd_byte(&tmp8u);
        for (uVar2 = (uint)count; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
          grid = (loc)loc(wVar6,y);
          square_set_feat((chunk_conflict *)c_00,grid,(uint)tmp8u);
          wVar6 = wVar6 + L'\x01';
          if (c_00->width <= wVar6) {
            y = y + L'\x01';
            wVar6 = L'\0';
            if (c_00->height <= y) break;
          }
        }
      } while( true );
    }
    wVar6 = L'\0';
LAB_0015efd3:
    if (y < c_00->height) {
      rd_byte(&count);
      rd_byte(&tmp8u);
      for (uVar2 = (uint)count; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
        c_00->squares[y][wVar6].info[uVar7] = tmp8u;
        wVar6 = wVar6 + L'\x01';
        if (c_00->width <= wVar6) {
          y = y + L'\x01';
          wVar6 = L'\0';
          if (c_00->height <= y) break;
        }
      }
      goto LAB_0015efd3;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static int rd_dungeon_aux(struct chunk **c)
{
	struct chunk *c1;
	int i, n, y, x;

	uint16_t height, width;

	uint8_t count;
	uint8_t tmp8u;
	uint16_t tmp16u;
	char name[100];

	/* Header info */
	rd_string(name, sizeof(name));
	if (streq(name, "arena") && (*c == cave)) {
		player->upkeep->arena_level = true;
	}
	rd_u16b(&height);
	rd_u16b(&width);

	/* We need a cave struct */
	c1 = cave_new(height, width);
	c1->name = string_make(name);

    /* Run length decoding of cave->squares[y][x].info */
	for (n = 0; n < square_size; n++) {
		/* Load the dungeon data */
		for (x = y = 0; y < c1->height; ) {
			/* Grab RLE info */
			rd_byte(&count);
			rd_byte(&tmp8u);

			/* Apply the RLE info */
			for (i = count; i > 0; i--) {
				/* Extract "info" */
				c1->squares[y][x].info[n] = tmp8u;

				/* Advance/Wrap */
				if (++x >= c1->width) {
					/* Wrap */
					x = 0;

					/* Advance/Wrap */
					if (++y >= c1->height) break;
				}
			}
		}
	}

	/* Run length decoding of dungeon data */
	for (x = y = 0; y < c1->height; ) {
		/* Grab RLE info */
		rd_byte(&count);
		rd_byte(&tmp8u);

		/* Apply the RLE info */
		for (i = count; i > 0; i--) {
			/* Extract "feat" */
			square_set_feat(c1, loc(x, y), tmp8u);

			/* Advance/Wrap */
			if (++x >= c1->width) {
				/* Wrap */
				x = 0;

				/* Advance/Wrap */
				if (++y >= c1->height) break;
			}
		}
	}


	/* Read "feeling" */
	rd_byte(&tmp8u);
	c1->feeling = tmp8u;
	rd_u16b(&tmp16u);
	c1->feeling_squares = tmp16u;
	rd_s32b(&c1->turn);

	/* Read connector info */
	if (OPT(player, birth_levels_persist)) {
		rd_byte(&tmp8u);
		while (tmp8u != 0xff) {
			struct connector *current = mem_zalloc(sizeof *current);
			current->info = mem_zalloc(square_size * sizeof(bitflag));
			current->grid.x = tmp8u;
			rd_byte(&tmp8u);
			current->grid.y = tmp8u;
			rd_byte(&current->feat);
			for (n = 0; n < square_size; n++) {
				rd_byte(&current->info[n]);
			}
			current->next = c1->join;
			c1->join = current;
			rd_byte(&tmp8u);
		}
	}

	/* Assign */
	*c = c1;

	return 0;
}